

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-test.c++
# Opt level: O2

void __thiscall kj::_::anon_unknown_0::TestCase96::run(TestCase96 *this)

{
  ThrowingDestructor t_1;
  char *local_4e0;
  ThrowingDestructor t;
  DebugComparison<const_char_(&)[31],_kj::StringPtr> _kjCondition;
  Maybe<kj::Exception> e;
  StringPtr local_1a0 [25];
  
  UnwindDetector::UnwindDetector(&t.super_UnwindDetector);
  ThrowingDestructor::~ThrowingDestructor(&t);
  e.ptr.isSet = false;
  _kjCondition.left._0_1_ = 0;
  _kjCondition.right.content.ptr =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
  ;
  _kjCondition.right.content.size_._0_4_ = 0x69;
  AddFailureAdapter::operator<<
            ((AddFailureAdapter *)&_kjCondition,(char (*) [19])"Expected exception");
  AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_kjCondition);
  UnwindDetector::UnwindDetector(&t_1.super_UnwindDetector);
  Debug::Fault::Fault<kj::Exception::Type,char_const(&)[4]>
            ((Fault *)local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
             ,0x6f,FAILED,(char *)0x0,"\"baz\"",(char (*) [4])0x1c55c2);
  Debug::Fault::~Fault((Fault *)local_1a0);
  ThrowingDestructor::~ThrowingDestructor(&t_1);
  _kjCondition.left._0_1_ = 0;
  Maybe<kj::Exception>::operator=(&e,(Maybe<kj::Exception> *)&_kjCondition);
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition);
  if (e.ptr.isSet == true) {
    local_4e0 = "baz";
    local_1a0[0].content.ptr = e.ptr.field_1.value.description.content.ptr;
    if (e.ptr.field_1.value.description.content.size_ == 0) {
      local_1a0[0].content.ptr = "";
    }
    local_1a0[0].content.size_ =
         e.ptr.field_1.value.description.content.size_ +
         (e.ptr.field_1.value.description.content.size_ == 0);
    DebugExpression<char_const(&)[4]>::operator==
              ((DebugComparison<const_char_(&)[4],_kj::StringPtr> *)&_kjCondition,
               (DebugExpression<char_const(&)[4]> *)&local_4e0,local_1a0);
    if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
      if (e.ptr.field_1.value.description.content.size_ == 0) {
        e.ptr.field_1.value.description.content.ptr = "";
      }
      local_1a0[0].content.size_ =
           e.ptr.field_1.value.description.content.size_ +
           (e.ptr.field_1.value.description.content.size_ == 0);
      local_1a0[0].content.ptr = e.ptr.field_1.value.description.content.ptr;
      Debug::
      log<char_const(&)[50],kj::_::DebugComparison<char_const(&)[4],kj::StringPtr>&,char_const(&)[4],kj::StringPtr>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
                 ,0x75,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (ex.getDescription())\", _kjCondition, \"baz\", ex.getDescription()"
                 ,(char (*) [50])"failed: expected (\"baz\") == (ex.getDescription())",
                 (DebugComparison<const_char_(&)[4],_kj::StringPtr> *)&_kjCondition,
                 (char (*) [4])0x1c55c2,local_1a0);
    }
  }
  else {
    _kjCondition.left._0_1_ = 0;
    _kjCondition.right.content.ptr =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
    ;
    _kjCondition.right.content.size_._0_4_ = 0x77;
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)&_kjCondition,(char (*) [19])"Expected exception");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_kjCondition);
  }
  NullableValue<kj::Exception>::~NullableValue(&e.ptr);
  return;
}

Assistant:

~ThrowingDestructor() noexcept(false) {
    catchExceptionsIfUnwinding([]() {
      KJ_FAIL_ASSERT("this is a test, not a real bug");
    });
  }